

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[5]>(XmlWriter *this,string *name,char (*attribute) [5])

{
  size_t sVar1;
  XmlWriter *pXVar2;
  ostringstream oss;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  sVar1 = strlen(*attribute);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,*attribute,sVar1);
  std::__cxx11::stringbuf::str();
  pXVar2 = writeAttribute(this,name,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return pXVar2;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            std::ostringstream oss;
            oss << attribute;
            return writeAttribute( name, oss.str() );
        }